

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rudp.cpp
# Opt level: O0

int __thiscall rudp::session::connect(session *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int extraout_EAX;
  undefined4 in_register_00000034;
  int in_R8D;
  anon_class_56_3_58ed26c9 local_80;
  function<void_(bool)> local_48;
  undefined1 local_28 [24];
  function<void_(bool,_unsigned_int)> *cb_local;
  session *this_local;
  
  local_28._16_8_ = CONCAT44(in_register_00000034,__fd);
  this->client = true;
  cb_local = (function<void_(bool,_unsigned_int)> *)this;
  generate_syn((session *)local_28,SUB81(this,0));
  local_80.this = this;
  std::enable_shared_from_this<rudp::session>::shared_from_this
            ((enable_shared_from_this<rudp::session> *)&local_80.this_);
  std::function<void_(bool,_unsigned_int)>::function
            (&local_80.cb,(function<void_(bool,_unsigned_int)> *)local_28._16_8_);
  std::function<void(bool)>::
  function<rudp::session::connect(std::function<void(bool,unsigned_int)>const&)::__0,void>
            ((function<void(bool)> *)&local_48,&local_80);
  send(this,(int)local_28,(void *)0x0,(size_t)&local_48,in_R8D);
  std::function<void_(bool)>::~function(&local_48);
  connect(std::function<void(bool,unsigned_int)>const&)::$_0::~__0((__0 *)&local_80);
  std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>::~shared_ptr
            ((shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_> *)local_28);
  return extraout_EAX;
}

Assistant:

void session::connect( const std::function< void( bool, uint32_t ) > &cb ) {
    client = true;
    send( generate_syn( false ), false, [this,this_=shared_from_this(),cb]( bool status ) {
      cb( status, self_config.connection_identifier );
    } );
  }